

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaders.cpp
# Opt level: O1

int __thiscall fw::ShaderProgram::link(ShaderProgram *this,char *__from,char *__to)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  GLint success;
  GLchar infoLog [512];
  int local_21c;
  char local_218 [520];
  
  (*glad_glLinkProgram)(this->_program);
  iVar1 = (*glad_glGetProgramiv)(this->_program,0x8b82,&local_21c);
  if (local_21c == 0) {
    (*glad_glGetProgramInfoLog)(this->_program,0x200,(GLsizei *)0x0,local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Shader link",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    poVar2 = (ostream *)std::ostream::flush();
    sVar3 = strlen(local_218);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_218,sVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    iVar1 = std::ostream::flush();
  }
  return iVar1;
}

Assistant:

void ShaderProgram::link() {
  glLinkProgram(_program);

  GLint success;
  GLchar infoLog[512];
  glGetProgramiv(_program, GL_LINK_STATUS, &success);
  if (!success) {
      glGetProgramInfoLog(_program, 512, NULL, infoLog);
      std::cout << "Error: Shader link" << std::endl << infoLog << std::endl;
  }
}